

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall ccs::Node::activate(Node *this,Specificity *spec,SearchState *searchState)

{
  bool bVar1;
  pointer propertyName;
  pointer ppVar2;
  __shared_ptr_access<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  __shared_ptr_access<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  element_type *peVar4;
  _Self local_60;
  _Self local_58;
  iterator it_2;
  _Self local_48;
  iterator it_1;
  _Self local_38;
  _Self local_30;
  const_iterator it;
  SearchState *searchState_local;
  Specificity *spec_local;
  Node *this_local;
  
  SearchState::constrain(searchState,&this->constraints);
  it._M_node = *(_Base_ptr *)spec;
  bVar1 = SearchState::add(searchState,(Specificity)it._M_node,this);
  if (bVar1) {
    local_30._M_node =
         (_Base_ptr)
         std::
         multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
         ::begin(&this->props);
    while( true ) {
      local_38._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>_>
           ::end(&this->props);
      bVar1 = std::operator!=(&local_30,&local_38);
      if (!bVar1) break;
      propertyName = std::
                     _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
                     ::operator->(&local_30);
      it_1._M_node = *(_Base_ptr *)spec;
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
               ::operator->(&local_30);
      SearchState::cacheProperty
                (searchState,&propertyName->first,(Specificity)it_1._M_node,&ppVar2->second);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccs::Property>_>
      ::operator++(&local_30);
    }
    local_48._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<ccs::AndTally>,_std::less<std::shared_ptr<ccs::AndTally>_>,_std::allocator<std::shared_ptr<ccs::AndTally>_>_>
         ::begin(&this->andTallies_);
    while( true ) {
      it_2._M_node = (_Base_ptr)
                     std::
                     set<std::shared_ptr<ccs::AndTally>,_std::less<std::shared_ptr<ccs::AndTally>_>,_std::allocator<std::shared_ptr<ccs::AndTally>_>_>
                     ::end(&this->andTallies_);
      bVar1 = std::operator!=(&local_48,(_Self *)&it_2);
      if (!bVar1) break;
      this_00 = (__shared_ptr_access<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>_>::operator*(&local_48);
      peVar3 = std::__shared_ptr_access<ccs::AndTally,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      (*(peVar3->super_Tally)._vptr_Tally[2])(peVar3,this,spec,searchState);
      std::_Rb_tree_const_iterator<std::shared_ptr<ccs::AndTally>_>::operator++(&local_48);
    }
    local_58._M_node =
         (_Base_ptr)
         std::
         set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
         ::begin(&this->orTallies_);
    while( true ) {
      local_60._M_node =
           (_Base_ptr)
           std::
           set<std::shared_ptr<ccs::OrTally>,_std::less<std::shared_ptr<ccs::OrTally>_>,_std::allocator<std::shared_ptr<ccs::OrTally>_>_>
           ::end(&this->orTallies_);
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      this_01 = (__shared_ptr_access<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>::operator*(&local_58);
      peVar4 = std::__shared_ptr_access<ccs::OrTally,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_01);
      (*(peVar4->super_Tally)._vptr_Tally[2])(peVar4,this,spec,searchState);
      std::_Rb_tree_const_iterator<std::shared_ptr<ccs::OrTally>_>::operator++(&local_58);
    }
  }
  return;
}

Assistant:

void activate(const Specificity &spec, SearchState &searchState) const {
    searchState.constrain(constraints);
    if (searchState.add(spec, this)) {
      for (auto it = props.begin(); it != props.end(); ++it)
        searchState.cacheProperty(it->first, spec, &it->second);
      for (auto it = andTallies_.begin(); it != andTallies_.end(); ++it)
        (*it)->activate(*this, spec, searchState);
      for (auto it = orTallies_.begin(); it != orTallies_.end(); ++it)
        (*it)->activate(*this, spec, searchState);
    }
  }